

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Base64.c
# Opt level: O1

int cmsysBase64_Decode3(uchar *src,uchar *dest)

{
  byte bVar1;
  byte bVar2;
  byte bVar3;
  uint uVar4;
  uint uVar5;
  
  uVar4 = 0;
  uVar5 = 0;
  if ((((kwsysBase64DecodeTable[*src] != 0xff) &&
       (bVar1 = kwsysBase64DecodeTable[src[1]], uVar5 = uVar4, bVar1 != 0xff)) &&
      (bVar2 = kwsysBase64DecodeTable[src[2]], bVar2 != 0xff)) &&
     (bVar3 = kwsysBase64DecodeTable[src[3]], bVar3 != 0xff)) {
    *dest = bVar1 >> 4 & 3 | kwsysBase64DecodeTable[*src] << 2;
    dest[1] = bVar2 >> 2 & 0xf | bVar1 << 4;
    dest[2] = bVar3 & 0x3f | bVar2 << 6;
    uVar5 = 1;
    if (src[2] != '=') {
      uVar5 = src[3] == '=' ^ 3;
    }
  }
  return uVar5;
}

Assistant:

int kwsysBase64_Decode3(const unsigned char* src, unsigned char* dest)
{
  unsigned char d0, d1, d2, d3;

  d0 = kwsysBase64DecodeChar(src[0]);
  d1 = kwsysBase64DecodeChar(src[1]);
  d2 = kwsysBase64DecodeChar(src[2]);
  d3 = kwsysBase64DecodeChar(src[3]);

  /* Make sure all characters were valid */

  if (d0 == 0xFF || d1 == 0xFF || d2 == 0xFF || d3 == 0xFF) {
    return 0;
  }

  /* Decode the 3 bytes */

  dest[0] = (unsigned char)(((d0 << 2) & 0xFC) | ((d1 >> 4) & 0x03));
  dest[1] = (unsigned char)(((d1 << 4) & 0xF0) | ((d2 >> 2) & 0x0F));
  dest[2] = (unsigned char)(((d2 << 6) & 0xC0) | ((d3 >> 0) & 0x3F));

  /* Return the number of bytes actually decoded */

  if (src[2] == '=') {
    return 1;
  }
  if (src[3] == '=') {
    return 2;
  }
  return 3;
}